

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

void Search::free_final_item(final_item *p)

{
  undefined8 *puVar1;
  
  puVar1 = *(undefined8 **)p;
  if ((void *)*puVar1 != (void *)0x0) {
    free((void *)*puVar1);
  }
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  operator_delete(*(void **)p);
  if (*(final_item **)(p + 8) != p + 0x18) {
    operator_delete(*(final_item **)(p + 8));
  }
  operator_delete(p);
  return;
}

Assistant:

void free_final_item(final_item* p)
{
  p->prefix->delete_v();
  delete p->prefix;
  delete p;
}